

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  byte bVar10;
  pointer peVar11;
  multi_learner *predict;
  vw *pvVar12;
  vw *in_RSI;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  option_group_definition new_options;
  bool explore_eval_option;
  free_ptr<EXPLORE_EVAL::explore_eval> data;
  string *in_stack_fffffffffffffc18;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  base_learner *in_stack_fffffffffffffc30;
  allocator *in_stack_fffffffffffffc38;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  option_group_definition *in_stack_fffffffffffffc70;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  undefined4 local_280;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [48];
  learner<char,_char> *in_stack_fffffffffffffde0;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  byte local_29;
  vw *local_18;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *local_10
  ;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<EXPLORE_EVAL::explore_eval>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Explore evaluation",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"explore_eval",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffffc28,(bool *)in_stack_fffffffffffffc20);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"Evaluate explore_eval adf policies",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffc70,
             (typed_option<bool> *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"multiplier",&local_251);
  std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
            ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2db9cf);
  VW::config::make_option<float>(in_stack_fffffffffffffc28,(float *)in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"Multiplier used to make all rejection sample probabilities <= 1",&local_279)
  ;
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffffc70,
             (typed_option<float> *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffffc20);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffc20);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pvVar12 = local_18;
    peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                        ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2dbce6);
    plVar9 = local_10;
    peVar11->all = pvVar12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"multiplier",&local_2a1);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    if ((bVar10 & 1) == 0) {
      peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                          ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2dbdd2);
      peVar11->multiplier = 1.0;
    }
    else {
      peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                          ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2dbd76);
      peVar11->fixed_multiplier = true;
    }
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"cb_explore_adf",&local_2c9);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"cb_explore_adf",&local_2f1);
      in_stack_fffffffffffffc38 = &local_319;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"",in_stack_fffffffffffffc38);
      (**(code **)(*(long *)local_10 + 0x28))(local_10,local_2f0,local_318);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      in_stack_fffffffffffffc40 = local_10;
    }
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    in_stack_fffffffffffffc30 =
         setup_base((options_i *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    predict = LEARNER::as_multiline<char,char>(in_stack_fffffffffffffde0);
    ppVar1 = local_18->p;
    (ppVar1->lp).label_size = DAT_00490008;
    puVar8 = PTR_test_label_00490000;
    puVar7 = PTR_weight_0048fff0;
    puVar6 = PTR_delete_label_0048ffe8;
    puVar5 = PTR_read_cached_label_0048ffe0;
    puVar4 = PTR_cache_label_0048ffd8;
    puVar3 = PTR_parse_label_0048ffd0;
    puVar2 = CB::cb_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_0048fff8;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
    local_18->label_type = cb;
    pvVar12 = (vw *)LEARNER::
                    init_learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<EXPLORE_EVAL::explore_eval> *)in_stack_fffffffffffffc40,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffffc38,
                               (_func_void_explore_eval_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)in_stack_fffffffffffffc30,
                               (_func_void_explore_eval_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)predict,(size_t)in_stack_fffffffffffffc20,pred_type);
    in_stack_fffffffffffffc20 = pvVar12;
    LEARNER::
    learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example((learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)pvVar12,EXPLORE_EVAL::finish_multiline_example);
    LEARNER::
    learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish(in_stack_fffffffffffffc40,(_func_void_explore_eval_ptr *)in_stack_fffffffffffffc38);
    local_8 = LEARNER::
              make_base<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>
                        ((learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
                          *)pvVar12);
  }
  local_280 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc20);
  std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)in_stack_fffffffffffffc30);
  return local_8;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}